

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::expandReplacementList
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> *tokens,
          SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
          *alreadyExpanded)

{
  Info *pIVar1;
  char *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  SyntaxKind SVar9;
  uint uVar10;
  int iVar11;
  MacroActualArgumentListSyntax *actualArgs;
  undefined4 extraout_var;
  SourceLocation location;
  Diagnostic *this_00;
  value_type *elements_1;
  Info *pIVar12;
  ulong uVar13;
  size_t extraout_RDX;
  DefineDirectiveSyntax *pDVar14;
  value_type *elements_2;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  MacroDef MVar27;
  string_view arg;
  undefined1 local_340 [64];
  span<const_slang::parsing::Token,_18446744073709551615UL> expanded;
  MacroParser local_2b8;
  undefined1 local_298 [32];
  SyntaxNode *pSStack_278;
  undefined2 local_270;
  SmallVector<slang::parsing::Token,_16UL> expansionBuffer;
  SmallVector<slang::parsing::Token,_16UL> outBuffer;
  
  outBuffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)outBuffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  outBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  outBuffer.super_SmallVectorBase<slang::parsing::Token>.cap = 0x10;
  expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.cap = 0x10;
  local_2b8.buffer._M_ptr = tokens->_M_ptr;
  local_2b8.buffer._M_extent._M_extent_value = (tokens->_M_extent)._M_extent_value;
  local_2b8.currentIndex = 0;
  local_340._56_8_ = tokens;
  local_2b8.pp = this;
  Token::Token((Token *)local_340);
  local_340._32_8_ = &(alreadyExpanded->super_Storage).field_0x48;
  bVar8 = false;
  while( true ) {
    local_340._0_16_ = (undefined1  [16])MacroParser::next(&local_2b8);
    pIVar12 = local_340._8_8_;
    if (pIVar12 == (Info *)0x0) break;
    tokens = (span<const_slang::parsing::Token,_18446744073709551615UL> *)local_340;
    if ((local_340._0_2_ == Directive) &&
       (SVar9 = Token::directiveKind((Token *)local_340), SVar9 == MacroUsage)) {
      MVar27 = findMacro(this,(Token)local_340._0_16_);
      local_340._16_8_ = MVar27.syntax;
      local_340._24_4_ = MVar27.intrinsic;
      local_340._28_2_ = MVar27._12_2_;
      if (((DefineDirectiveSyntax *)local_340._16_8_ == (DefineDirectiveSyntax *)0x0) &&
         (local_340._24_4_ == None)) {
        SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                  (&outBuffer.super_SmallVectorBase<slang::parsing::Token>,(Token *)local_340);
      }
      else {
        if (local_340._24_4_ == None) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_340._16_8_;
          uVar13 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar18 = uVar13 >> (alreadyExpanded->field_0x50 & 0x3f);
          uVar3 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar13 & 0xff];
          uVar15 = 0;
          do {
            pcVar2 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar18 * 0x10);
            cVar19 = (char)uVar3;
            auVar24[0] = -(*pcVar2 == cVar19);
            cVar20 = (char)((uint)uVar3 >> 8);
            auVar24[1] = -(pcVar2[1] == cVar20);
            cVar21 = (char)((uint)uVar3 >> 0x10);
            auVar24[2] = -(pcVar2[2] == cVar21);
            bVar23 = (byte)((uint)uVar3 >> 0x18);
            auVar24[3] = -(pcVar2[3] == bVar23);
            auVar24[4] = -(pcVar2[4] == cVar19);
            auVar24[5] = -(pcVar2[5] == cVar20);
            auVar24[6] = -(pcVar2[6] == cVar21);
            auVar24[7] = -(pcVar2[7] == bVar23);
            auVar24[8] = -(pcVar2[8] == cVar19);
            auVar24[9] = -(pcVar2[9] == cVar20);
            auVar24[10] = -(pcVar2[10] == cVar21);
            auVar24[0xb] = -(pcVar2[0xb] == bVar23);
            auVar24[0xc] = -(pcVar2[0xc] == cVar19);
            auVar24[0xd] = -(pcVar2[0xd] == cVar20);
            auVar24[0xe] = -(pcVar2[0xe] == cVar21);
            auVar24[0xf] = -(pcVar2[0xf] == bVar23);
            uVar10 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
            if (uVar10 != 0) {
              do {
                uVar4 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                if ((DefineDirectiveSyntax *)local_340._16_8_ ==
                    *(DefineDirectiveSyntax **)
                     (*(long *)&alreadyExpanded->field_0x68 + uVar18 * 0x78 + (ulong)uVar4 * 8)) {
                  location = Token::location((Token *)local_340);
                  this_00 = addDiag(this,(DiagCode)0x150004,location);
                  arg = Token::valueText((Token *)local_340);
                  tokens = (span<const_slang::parsing::Token,_18446744073709551615UL> *)arg._M_len;
                  Diagnostic::operator<<(this_00,arg);
                  goto LAB_00264de4;
                }
                uVar10 = uVar10 - 1 & uVar10;
              } while (uVar10 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & pcVar2[0xf]) == 0)
            break;
            lVar17 = uVar18 + uVar15;
            uVar15 = uVar15 + 1;
            uVar18 = lVar17 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
          } while (uVar15 <= *(ulong *)&alreadyExpanded->field_0x58);
        }
        if ((DefineDirectiveSyntax *)local_340._16_8_ == (DefineDirectiveSyntax *)0x0) {
          pDVar14 = (DefineDirectiveSyntax *)0x0;
LAB_00264b23:
          actualArgs = (MacroActualArgumentListSyntax *)0x0;
        }
        else {
          pDVar14 = (DefineDirectiveSyntax *)local_340._16_8_;
          if (((DefineDirectiveSyntax *)local_340._16_8_)->formalArguments ==
              (MacroFormalArgumentListSyntax *)0x0) goto LAB_00264b23;
          tokens = (span<const_slang::parsing::Token,_18446744073709551615UL> *)local_340._0_8_;
          actualArgs = MacroParser::parseActualArgumentList(&local_2b8,(Token)local_340._0_16_);
          pDVar14 = (DefineDirectiveSyntax *)local_340._16_8_;
          if (actualArgs == (MacroActualArgumentListSyntax *)0x0) goto LAB_00264de4;
        }
        tokens = (span<const_slang::parsing::Token,_18446744073709551615UL> *)pDVar14;
        expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.len = 0;
        local_298._0_8_ = this->sourceManager;
        local_298._8_8_ = this->alloc;
        local_298._16_8_ = &expansionBuffer;
        local_298._24_8_ = local_340._0_8_;
        pSStack_278 = (SyntaxNode *)local_340._8_8_;
        local_270._0_1_ = false;
        local_270._1_1_ = false;
        MVar27.builtIn = (bool)local_340[0x1c];
        MVar27.commandLine = (bool)local_340[0x1d];
        MVar27.intrinsic = local_340._24_4_;
        MVar27._14_2_ = local_340._30_2_;
        MVar27.syntax = (DefineDirectiveSyntax *)tokens;
        bVar8 = expandMacro(this,MVar27,(MacroExpansion *)local_298,actualArgs);
        if (!bVar8) goto LAB_00264de4;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_340._16_8_;
        uVar15 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar13 = uVar15 >> (alreadyExpanded->field_0x50 & 0x3f);
        local_340._48_8_ = *(undefined8 *)&alreadyExpanded->field_0x60;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        local_340._40_8_ = *(undefined8 *)&alreadyExpanded->field_0x58;
        uVar16 = 0;
        uVar18 = uVar13;
        do {
          pIVar1 = (Info *)(local_340._48_8_ + uVar18 * 0x10);
          bVar23 = (pIVar1->location).field_0x7;
          cVar19 = (char)uVar3;
          auVar25[0] = -(*(char *)&pIVar1->rawTextPtr == cVar19);
          cVar20 = (char)((uint)uVar3 >> 8);
          auVar25[1] = -(*(char *)((long)&pIVar1->rawTextPtr + 1) == cVar20);
          cVar21 = (char)((uint)uVar3 >> 0x10);
          auVar25[2] = -(*(char *)((long)&pIVar1->rawTextPtr + 2) == cVar21);
          bVar22 = (byte)((uint)uVar3 >> 0x18);
          auVar25[3] = -(*(byte *)((long)&pIVar1->rawTextPtr + 3) == bVar22);
          auVar25[4] = -(*(char *)((long)&pIVar1->rawTextPtr + 4) == cVar19);
          auVar25[5] = -(*(char *)((long)&pIVar1->rawTextPtr + 5) == cVar20);
          auVar25[6] = -(*(char *)((long)&pIVar1->rawTextPtr + 6) == cVar21);
          auVar25[7] = -(*(byte *)((long)&pIVar1->rawTextPtr + 7) == bVar22);
          auVar25[8] = -(*(char *)&pIVar1->location == cVar19);
          auVar25[9] = -((pIVar1->location).field_0x1 == cVar20);
          auVar25[10] = -((pIVar1->location).field_0x2 == cVar21);
          auVar25[0xb] = -((pIVar1->location).field_0x3 == bVar22);
          auVar25[0xc] = -((pIVar1->location).field_0x4 == cVar19);
          auVar25[0xd] = -((pIVar1->location).field_0x5 == cVar20);
          auVar25[0xe] = -((pIVar1->location).field_0x6 == cVar21);
          auVar25[0xf] = -(bVar23 == bVar22);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
          if (uVar10 != 0) {
            do {
              uVar4 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              if ((DefineDirectiveSyntax *)local_340._16_8_ ==
                  *(DefineDirectiveSyntax **)
                   (*(long *)&alreadyExpanded->field_0x68 + uVar18 * 0x78 + (ulong)uVar4 * 8))
              goto LAB_00264c94;
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar23) == 0) break;
          lVar17 = uVar18 + uVar16;
          uVar16 = uVar16 + 1;
          uVar18 = lVar17 + 1U & local_340._40_8_;
        } while (uVar16 <= (ulong)local_340._40_8_);
        if (*(ulong *)&alreadyExpanded->field_0x78 < *(ulong *)&alreadyExpanded->field_0x70) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((locator *)&expanded,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                      *)local_340._32_8_,uVar13,uVar15,(DefineDirectiveSyntax **)(local_340 + 0x10))
          ;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((locator *)&expanded,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                      *)local_340._32_8_,uVar15,(DefineDirectiveSyntax **)(local_340 + 0x10));
        }
LAB_00264c94:
        expanded._M_ptr = expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.data_;
        expanded._M_extent._M_extent_value =
             expansionBuffer.super_SmallVectorBase<slang::parsing::Token>.len;
        tokens = &expanded;
        bVar8 = expandReplacementList(this,tokens,alreadyExpanded);
        if (!bVar8) goto LAB_00264de4;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_340._16_8_;
        uVar13 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar18 = uVar13 >> (alreadyExpanded->field_0x50 & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar13 & 0xff];
        uVar15 = 0;
        do {
          pcVar2 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar18 * 0x10);
          cVar19 = (char)uVar3;
          auVar26[0] = -(*pcVar2 == cVar19);
          cVar20 = (char)((uint)uVar3 >> 8);
          auVar26[1] = -(pcVar2[1] == cVar20);
          cVar21 = (char)((uint)uVar3 >> 0x10);
          auVar26[2] = -(pcVar2[2] == cVar21);
          bVar23 = (byte)((uint)uVar3 >> 0x18);
          auVar26[3] = -(pcVar2[3] == bVar23);
          auVar26[4] = -(pcVar2[4] == cVar19);
          auVar26[5] = -(pcVar2[5] == cVar20);
          auVar26[6] = -(pcVar2[6] == cVar21);
          auVar26[7] = -(pcVar2[7] == bVar23);
          auVar26[8] = -(pcVar2[8] == cVar19);
          auVar26[9] = -(pcVar2[9] == cVar20);
          auVar26[10] = -(pcVar2[10] == cVar21);
          auVar26[0xb] = -(pcVar2[0xb] == bVar23);
          auVar26[0xc] = -(pcVar2[0xc] == cVar19);
          auVar26[0xd] = -(pcVar2[0xd] == cVar20);
          auVar26[0xe] = -(pcVar2[0xe] == cVar21);
          auVar26[0xf] = -(pcVar2[0xf] == bVar23);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
          if (uVar10 != 0) {
            do {
              uVar4 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              if ((DefineDirectiveSyntax *)local_340._16_8_ ==
                  *(DefineDirectiveSyntax **)
                   (*(long *)&alreadyExpanded->field_0x68 + uVar18 * 0x78 + (ulong)uVar4 * 8)) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                ::recover_slot((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                *)local_340._32_8_,
                               (uchar *)(uVar18 * 0x10 + *(long *)&alreadyExpanded->field_0x60 +
                                        (ulong)uVar4));
                goto LAB_00264d92;
              }
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & pcVar2[0xf]) == 0)
          break;
          lVar17 = uVar18 + uVar15;
          uVar15 = uVar15 + 1;
          uVar18 = lVar17 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
        } while (uVar15 <= *(ulong *)&alreadyExpanded->field_0x58);
LAB_00264d92:
        tokens = &expanded;
        SmallVectorBase<slang::parsing::Token>::
        append_range<std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                  (&outBuffer.super_SmallVectorBase<slang::parsing::Token>,tokens);
        bVar8 = true;
      }
    }
    else {
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&outBuffer.super_SmallVectorBase<slang::parsing::Token>,(Token *)local_340);
    }
  }
  if (bVar8) {
    tokens = (span<const_slang::parsing::Token,_18446744073709551615UL> *)this->alloc;
    iVar11 = SmallVectorBase<slang::parsing::Token>::copy
                       (&outBuffer.super_SmallVectorBase<slang::parsing::Token>,
                        (EVP_PKEY_CTX *)tokens,(EVP_PKEY_CTX *)0x0);
    *(pointer *)(SyntaxNode *)local_340._56_8_ = (pointer)CONCAT44(extraout_var,iVar11);
    ((__extent_storage<18446744073709551615UL> *)&((SyntaxNode *)local_340._56_8_)->parent)->
    _M_extent_value = extraout_RDX;
  }
LAB_00264de4:
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&expansionBuffer.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)tokens);
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&outBuffer.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)tokens);
  return pIVar12 == (Info *)0x0;
}

Assistant:

bool Preprocessor::expandReplacementList(
    std::span<Token const>& tokens, SmallSet<const DefineDirectiveSyntax*, 8>& alreadyExpanded) {

    SmallVector<Token, 16> outBuffer;
    SmallVector<Token, 16> expansionBuffer;

    bool expandedSomething = false;
    MacroParser parser(*this);
    parser.setBuffer(tokens);

    // loop through each token in the replacement list and expand it if it's a nested macro
    Token token;
    while ((token = parser.next())) {
        if (token.kind != TokenKind::Directive || token.directiveKind() != SyntaxKind::MacroUsage) {
            outBuffer.push_back(token);
            continue;
        }

        // lookup the macro definition
        auto macro = findMacro(token);
        if (!macro.valid()) {
            // If we couldn't find the macro, just keep trucking.
            // It's possible that a future expansion will make this valid.
            outBuffer.push_back(token);
            continue;
        }

        if (!macro.isIntrinsic() && alreadyExpanded.count(macro.syntax)) {
            addDiag(diag::RecursiveMacro, token.location()) << token.valueText();
            return false;
        }

        // parse arguments if necessary
        MacroActualArgumentListSyntax* actualArgs = nullptr;
        if (macro.needsArgs()) {
            actualArgs = parser.parseActualArgumentList(token);
            if (!actualArgs)
                return false;
        }

        expansionBuffer.clear();
        MacroExpansion expansion{sourceManager, alloc, expansionBuffer, token, false};
        if (!expandMacro(macro, expansion, actualArgs))
            return false;

        // Recursively expand out nested macros; this ensures that we detect
        // any potentially recursive macros.
        alreadyExpanded.insert(macro.syntax);
        std::span<const Token> expanded = expansionBuffer;
        if (!expandReplacementList(expanded, alreadyExpanded))
            return false;

        alreadyExpanded.erase(macro.syntax);
        outBuffer.append_range(expanded);
        expandedSomething = true;
    }

    // Make a heap copy of the tokens before we leave, if we actually expanded something.
    if (expandedSomething)
        tokens = outBuffer.copy(alloc);
    return true;
}